

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::image::anon_unknown_0::StoreTestInstance::verifyResult
          (TestStatus *__return_storage_ptr__,StoreTestInstance *this)

{
  Texture *this_00;
  VkFormat format;
  bool bVar1;
  DeviceInterface *vkd;
  VkDevice device_00;
  Buffer *this_01;
  Allocation *this_02;
  VkDeviceSize offset;
  void *data;
  TestContext *this_03;
  TestLog *log;
  allocator<char> local_149;
  string local_148;
  undefined4 local_128;
  allocator<char> local_121;
  string local_120;
  ConstPixelBufferAccess local_100;
  ConstPixelBufferAccess local_d8;
  TextureFormat local_b0;
  undefined1 local_a8 [8];
  ConstPixelBufferAccess result;
  Allocation *alloc;
  TextureLevel reference;
  IVec3 imageSize;
  VkDevice device;
  DeviceInterface *vk;
  StoreTestInstance *this_local;
  
  vkd = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  device_00 = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  this_00 = (Texture *)((long)&reference.m_data.m_cap + 4);
  Texture::size(this_00);
  generateReferenceImage
            ((TextureLevel *)&alloc,(IVec3 *)this_00,(this->super_BaseTestInstance).m_format);
  this_01 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->m_imageBuffer).
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  this_02 = image::Buffer::getAllocation(this_01);
  result.m_data = (void *)::vk::Allocation::getMemory(this_02);
  offset = ::vk::Allocation::getOffset(this_02);
  ::vk::invalidateMappedMemoryRange
            (vkd,device_00,(VkDeviceMemory)result.m_data,offset,this->m_imageSizeBytes);
  local_b0 = ::vk::mapVkFormat((this->super_BaseTestInstance).m_format);
  data = ::vk::Allocation::getHostPtr(this_02);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_a8,&local_b0,
             (IVec3 *)((long)&reference.m_data.m_cap + 4),data);
  this_03 = Context::getTestContext((this->super_BaseTestInstance).super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_03);
  format = (this->super_BaseTestInstance).m_format;
  tcu::TextureLevel::getAccess(&local_d8,(TextureLevel *)&alloc);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_100,(ConstPixelBufferAccess *)local_a8)
  ;
  bVar1 = comparePixelBuffers(log,&(this->super_BaseTestInstance).m_texture,format,&local_d8,
                              &local_100);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Passed",&local_121);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"Image comparison failed",&local_149);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  local_128 = 1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&alloc);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus StoreTestInstance::verifyResult	(void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const tcu::IVec3 imageSize = m_texture.size();
	const tcu::TextureLevel reference = generateReferenceImage(imageSize, m_format);

	const Allocation& alloc = m_imageBuffer->getAllocation();
	invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_imageSizeBytes);
	const tcu::ConstPixelBufferAccess result(mapVkFormat(m_format), imageSize, alloc.getHostPtr());

	if (comparePixelBuffers(m_context.getTestContext().getLog(), m_texture, m_format, reference.getAccess(), result))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}